

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void syntaxerror(char *s,...)

{
  __va_list_tag *in_RCX;
  char *in_R8;
  undefined8 in_R9;
  va_list ap;
  
  typeerror((int)((ulong)in_R9 >> 0x20),in_R8,in_RCX);
  return;
}

Assistant:

void semerror(int type, int line, const char *fmt, ...) {
    fputs(error_tty_prefix, stdout);
    printf("Error type %d at Line %d: ", type, line);
    va_list ap;
    va_start(ap, fmt);
    vprintf(fmt, ap);
    fputs(error_tty_suffix, stdout);
    va_end(ap);
    putchar('\n');

    error_state = 1;
}